

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::arg_impl(QString *__return_storage_ptr__,QString *this,double a,int fieldWidth,char format,
                 int precision,QChar fillChar)

{
  Data *pDVar1;
  QStringView arg;
  QStringView larg;
  uint uVar2;
  undefined1 *puVar3;
  int iVar4;
  NumberOptions NVar5;
  undefined4 extraout_var;
  QArrayData *data;
  char cVar6;
  DoubleForm form;
  QArrayData *data_00;
  qsizetype qVar7;
  qsizetype qVar8;
  storage_type_conflict *psVar9;
  storage_type_conflict *psVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QStringView s;
  QStringView s_00;
  QLocale locale;
  QLocale local_80;
  QMessageLogger local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  s.m_data = (this->d).ptr;
  s.m_size = (this->d).size;
  findArgEscapes((ArgEscapeData *)&local_58,s);
  puVar3 = local_48;
  if (puStack_50 == (undefined1 *)0x0) {
    local_78.context.version = 2;
    local_78.context.line = 0;
    local_78.context.file._0_4_ = 0;
    local_78.context.file._4_4_ = 0;
    local_78.context.function._0_4_ = 0;
    local_78.context.function._4_4_ = 0;
    local_78.context.category = "default";
    if ((this->d).d == (Data *)0x0) {
      reallocData(this,(this->d).size,KeepSize);
    }
    QMessageLogger::warning
              (&local_78,"QString::arg: Argument missing: \"%ls\", %g",SUB84(a,0),(this->d).ptr);
    pDVar1 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = (this->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    bVar11 = fillChar.ucs == L'0';
    cVar6 = format + ' ';
    uVar2 = bVar11 + 0x40 + (uint)bVar11;
    if (0x19 < (int)format - 0x41U) {
      cVar6 = format;
      uVar2 = (uint)bVar11 * 2;
    }
    form = DFSignificantDigits;
    if (cVar6 != 'g') {
      form = (uint)(cVar6 != 'e');
    }
    qVar7 = 0;
    psVar10 = (storage_type_conflict *)0x0;
    data = (QArrayData *)0x0;
    if ((long)local_48 < (long)puStack_50) {
      iVar4 = QLocaleData::c((void *)0x0,(void *)(ulong)(uint)(int)format);
      QLocaleData::doubleToString
                ((QString *)&local_78,(QLocaleData *)CONCAT44(extraout_var,iVar4),a,precision,form,
                 fieldWidth,uVar2 + 0x200);
      data = (QArrayData *)CONCAT44(local_78.context.line,local_78.context.version);
      psVar10 = (storage_type_conflict *)
                CONCAT44(local_78.context.file._4_4_,local_78.context.file._0_4_);
      qVar7 = CONCAT44(local_78.context.function._4_4_,local_78.context.function._0_4_);
    }
    if ((long)puVar3 < 1) {
      qVar8 = 0;
      psVar9 = (storage_type_conflict *)0x0;
      data_00 = (QArrayData *)0x0;
    }
    else {
      local_80.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QLocale::QLocale(&local_80);
      NVar5 = QLocale::numberOptions(&local_80);
      if ((((QBasicAtomicInt *)((long)local_80.d.d.ptr + 8))->_q_value).super___atomic_base<int>.
          _M_i != 1) {
        QSharedDataPointer<QLocalePrivate>::detach_helper(&local_80.d);
      }
      QLocaleData::doubleToString
                ((QString *)&local_78,*(QLocaleData **)local_80.d.d.ptr,a,precision,form,fieldWidth,
                 ((uint)NVar5.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                        super_QFlagsStorage<QLocale::NumberOption>.i >> 4 & 1 |
                  ((uint)NVar5.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                         super_QFlagsStorage<QLocale::NumberOption>.i & 4) << 7 |
                  ((uint)NVar5.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                         super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | uVar2) ^ 0x220);
      data_00 = (QArrayData *)CONCAT44(local_78.context.line,local_78.context.version);
      psVar9 = (storage_type_conflict *)
               CONCAT44(local_78.context.file._4_4_,local_78.context.file._0_4_);
      qVar8 = CONCAT44(local_78.context.function._4_4_,local_78.context.function._0_4_);
      QLocale::~QLocale(&local_80);
    }
    arg.m_data = psVar10;
    arg.m_size = qVar7;
    larg.m_data = psVar9;
    larg.m_size = qVar8;
    s_00.m_data = (this->d).ptr;
    s_00.m_size = (this->d).size;
    replaceArgEscapes(__return_storage_ptr__,s_00,(ArgEscapeData *)&local_58,(long)fieldWidth,arg,
                      larg,fillChar);
    if (data_00 != (QArrayData *)0x0) {
      LOCK();
      (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
           (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data_00,2,0x10);
      }
    }
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::arg_impl(double a, int fieldWidth, char format, int precision, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (d.occurrences == 0) {
        qWarning("QString::arg: Argument missing: \"%ls\", %g", qUtf16Printable(*this), a);
        return *this;
    }

    unsigned flags = QLocaleData::NoFlags;
    // ZeroPadded sorts out left-padding when the fill is zero, to the right of sign:
    if (fillChar == u'0')
        flags |= QLocaleData::ZeroPadded;

    if (isAsciiUpper(format))
        flags |= QLocaleData::CapitalEorX;

    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;
    switch (QtMiscUtils::toAsciiLower(format)) {
    case 'f':
        form = QLocaleData::DFDecimal;
        break;
    case 'e':
        form = QLocaleData::DFExponent;
        break;
    case 'g':
        form = QLocaleData::DFSignificantDigits;
        break;
    default:
#if defined(QT_CHECK_RANGE)
        qWarning("QString::arg: Invalid format char '%c'", format);
#endif
        break;
    }

    QString arg;
    if (d.occurrences > d.locale_occurrences) {
        arg = QLocaleData::c()->doubleToString(a, precision, form, fieldWidth,
                                               flags | QLocaleData::ZeroPadExponent);
        Q_ASSERT(fillChar != u'0' || !qt_is_finite(a)
                 || fieldWidth <= arg.size());
    }

    QString localeArg;
    if (d.locale_occurrences > 0) {
        QLocale locale;

        const QLocale::NumberOptions numberOptions = locale.numberOptions();
        if (!(numberOptions & QLocale::OmitGroupSeparator))
            flags |= QLocaleData::GroupDigits;
        if (!(numberOptions & QLocale::OmitLeadingZeroInExponent))
            flags |= QLocaleData::ZeroPadExponent;
        if (numberOptions & QLocale::IncludeTrailingZeroesAfterDot)
            flags |= QLocaleData::AddTrailingZeroes;
        localeArg = locale.d->m_data->doubleToString(a, precision, form, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || !qt_is_finite(a)
                 || fieldWidth <= localeArg.size());
    }

    return replaceArgEscapes(*this, d, fieldWidth, arg, localeArg, fillChar);
}